

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_bitstream.c
# Opt level: O0

void ihevcd_bits_init(bitstrm_t *ps_bitstrm,UWORD8 *pu1_buf,UWORD32 u4_numbytes)

{
  uint uVar1;
  uint uVar2;
  UWORD32 *pu4_buf;
  UWORD32 u4_temp;
  UWORD32 u4_nxt_word;
  UWORD32 u4_cur_word;
  UWORD32 u4_numbytes_local;
  UWORD8 *pu1_buf_local;
  bitstrm_t *ps_bitstrm_local;
  
  uVar1 = *(uint *)pu1_buf;
  uVar2 = *(uint *)(pu1_buf + 4);
  ps_bitstrm->u4_bit_ofst = 0;
  ps_bitstrm->pu1_buf_base = pu1_buf;
  ps_bitstrm->pu4_buf = (UWORD32 *)(pu1_buf + 8);
  ps_bitstrm->u4_cur_word =
       uVar1 << 0x18 | (uVar1 & 0xff00) << 8 | (uVar1 & 0xff0000) >> 8 | uVar1 >> 0x18;
  ps_bitstrm->u4_nxt_word =
       uVar2 << 0x18 | (uVar2 & 0xff00) << 8 | (uVar2 & 0xff0000) >> 8 | uVar2 >> 0x18;
  ps_bitstrm->pu1_buf_max = pu1_buf + (ulong)u4_numbytes + 8;
  return;
}

Assistant:

void ihevcd_bits_init(bitstrm_t *ps_bitstrm,
                      UWORD8 *pu1_buf,
                      UWORD32 u4_numbytes)
{
    UWORD32 u4_cur_word;
    UWORD32 u4_nxt_word;
    UWORD32 u4_temp;
    UWORD32 *pu4_buf;

    pu4_buf     = (UWORD32 *)pu1_buf;
    u4_temp = *pu4_buf++;
    u4_cur_word = ITT_BIG_ENDIAN(u4_temp);
    u4_temp = *pu4_buf++;
    u4_nxt_word = ITT_BIG_ENDIAN(u4_temp);

    ps_bitstrm->u4_bit_ofst     = 0;
    ps_bitstrm->pu1_buf_base    = pu1_buf;
    ps_bitstrm->pu4_buf         = pu4_buf;
    ps_bitstrm->u4_cur_word     = u4_cur_word;
    ps_bitstrm->u4_nxt_word     = u4_nxt_word;

    ps_bitstrm->pu1_buf_max     = pu1_buf + u4_numbytes + 8;

    return;
}